

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlat_parser.c
# Opt level: O1

void XlatParse(void *yyp,int yymajor,FParseToken yyminor,FParseContext *context)

{
  uint *puVar1;
  byte bVar2;
  ushort uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  ushort *puVar7;
  FParseContext *pFVar8;
  long *plVar9;
  undefined8 *puVar10;
  FBoomArg *pFVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 *puVar19;
  FLineTrans *pFVar20;
  FSectorTrans *pFVar21;
  FSectorMask *pFVar22;
  undefined2 uVar23;
  undefined7 uVar24;
  undefined1 uVar25;
  ulong uVar26;
  ushort *puVar27;
  undefined8 *puVar28;
  int *piVar29;
  uint uVar30;
  long lVar31;
  int iVar32;
  int iVar33;
  undefined8 uVar34;
  int i;
  ulong uVar35;
  FParseToken *pFVar36;
  uchar uVar37;
  uint uVar38;
  int iVar39;
  double *pdVar40;
  ulong uVar41;
  int iVar42;
  int iVar43;
  long *plVar44;
  ulong uVar45;
  byte bVar46;
  FXlatExprState state;
  undefined8 local_b8;
  undefined4 auStack_b0 [3];
  undefined8 uStack_a4;
  undefined4 uStack_9c;
  undefined8 local_98;
  undefined6 uStack_90;
  undefined2 uStack_8a;
  undefined6 uStack_88;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  uint local_54;
  ulong local_50;
  ushort *local_48;
  FXlatExprState local_3c;
  
  bVar46 = 0;
  if (*yyp == 0) {
    __assert_fail("yypParser->yytos!=0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O1/src/xlat_parser.c"
                  ,0x740,"void XlatParse(void *, int, FParseToken, FParseContext *)");
  }
  *(FParseContext **)((long)yyp + 0x10) = context;
  if (yyTraceFILE != (FILE *)0x0) {
    fprintf((FILE *)yyTraceFILE,"%sInput \'%s\'\n",yyTracePrompt,yyTokenName[yymajor]);
    fflush((FILE *)yyTraceFILE);
  }
  uVar45 = (long)yyp + 0x18;
  local_50 = (long)yyp + 0x2220;
  local_48 = (ushort *)((long)yyp + 0x2278);
  uVar38 = yymajor;
  do {
    puVar19 = local_b8;
    puVar7 = *yyp;
    uVar3 = *puVar7;
    uVar26 = (ulong)uVar3;
    uVar37 = (uchar)uVar38;
    if (uVar26 < 0xe9) {
      if (99 < uVar3) {
        __assert_fail("stateno <= YY_SHIFT_COUNT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O1/src/xlat_parser.c"
                      ,0x2ec,"unsigned int yy_find_shift_action(yyParser *, unsigned char)");
      }
      if (uVar37 == 'G') {
        __assert_fail("iLookAhead!=YYNOCODE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O1/src/xlat_parser.c"
                      ,0x2ef,"unsigned int yy_find_shift_action(yyParser *, unsigned char)");
      }
      lVar31 = (ulong)(uVar38 & 0xff) + (ulong)yy_shift_ofst[uVar26];
      if (((uint)lVar31 < 0x166) &&
         ("+,-./012345)*8:;\x02\x03\x04\x05\x06\a\b\t\x0f\x02\x03\x04\x05\x06\a\b\t\x02\x03\x04\x05\x06\a\b\t\x05\x06\a\b\t ABC$%&"
          [lVar31] == uVar37)) {
        puVar27 = yy_action + lVar31;
      }
      else {
        puVar27 = yy_default + uVar26;
      }
      uVar3 = *puVar27;
    }
    uVar30 = (uint)uVar3;
    if (uVar30 < 0xe9) {
      *(ushort **)yyp = puVar7 + 0x2c;
      if (puVar7 + 0x2c < local_48) {
        uVar38 = uVar30 + 0x4e;
        if (uVar3 < 100) {
          uVar38 = uVar30;
        }
        puVar7[0x2c] = (ushort)uVar38;
        *(uchar *)(puVar7 + 0x2d) = uVar37;
        pFVar36 = &yyminor;
        pdVar40 = (double *)(puVar7 + 0x30);
        for (lVar31 = 10; lVar31 != 0; lVar31 = lVar31 + -1) {
          *pdVar40 = pFVar36->fval;
          pFVar36 = (FParseToken *)((long)pFVar36 + (ulong)bVar46 * -0x10 + 8);
          pdVar40 = pdVar40 + (ulong)bVar46 * -2 + 1;
        }
        yyTraceShift((yyParser *)yyp,uVar38);
      }
      else {
        yyStackOverflow((yyParser *)yyp);
      }
      *(int *)((long)yyp + 8) = *(int *)((long)yyp + 8) + -1;
      uVar38 = 0x47;
      goto LAB_005078a2;
    }
    if (0x136 < uVar30) {
      if (uVar30 != 0x137) {
        __assert_fail("yyact == YY_ERROR_ACTION",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O1/src/xlat_parser.c"
                      ,0x758,"void XlatParse(void *, int, FParseToken, FParseContext *)");
      }
      if (yyTraceFILE != (FILE *)0x0) {
        fprintf((FILE *)yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
        fflush((FILE *)yyTraceFILE);
      }
      if (*(int *)((long)yyp + 8) < 1) {
        pFVar8 = *(FParseContext **)((long)yyp + 0x10);
        FParseContext::PrintError(pFVar8,"syntax error");
        *(FParseContext **)((long)yyp + 0x10) = pFVar8;
      }
      *(undefined4 *)((long)yyp + 8) = 3;
      uVar38 = 0x47;
      if (yymajor == 0) {
        uVar34 = *(undefined8 *)((long)yyp + 0x10);
        if (yyTraceFILE != (FILE *)0x0) {
          fprintf((FILE *)yyTraceFILE,"%sFail!\n",yyTracePrompt);
          fflush((FILE *)yyTraceFILE);
        }
        while (uVar45 < *yyp) {
          yy_pop_parser_stack((yyParser *)yyp);
        }
        *(undefined8 *)((long)yyp + 0x10) = uVar34;
        *(undefined4 *)((long)yyp + 8) = 0xffffffff;
        uVar38 = 0x47;
      }
      goto LAB_005078a2;
    }
    uVar26 = (ulong)(uVar30 - 0xe9);
    pFVar8 = *(FParseContext **)((long)yyp + 0x10);
    if (yyTraceFILE != (FILE *)0x0) {
      fprintf((FILE *)yyTraceFILE,"%sReduce [%s], go to state %d.\n",yyTracePrompt,
              _ZL10yyRuleName_rel + *(int *)(_ZL10yyRuleName_rel + uVar26 * 4),
              (ulong)puVar7[(ulong)yyRuleInfo[uVar26].nrhs * -0x2c]);
      fflush((FILE *)yyTraceFILE);
    }
    uVar41 = (ulong)yyRuleInfo[uVar26].nrhs;
    if ((yyRuleInfo[uVar26].nrhs == 0) && (local_50 <= *yyp)) {
      yyStackOverflow((yyParser *)yyp);
      goto LAB_005078a2;
    }
    uVar12 = local_b8._4_4_;
    uVar24 = local_b8._1_7_;
    puVar28 = local_b8;
    switch(uVar26) {
    case 0:
      local_b8 = (undefined8 *)CONCAT44(uVar12,*(undefined4 *)(puVar7 + 4));
      puVar28 = local_b8;
      break;
    case 1:
      uVar30 = *(int *)(puVar7 + 4) + *(int *)(puVar7 + -0x54);
      goto LAB_005071d5;
    case 2:
      uVar30 = *(int *)(puVar7 + -0x54) - *(int *)(puVar7 + 4);
      goto LAB_005071d5;
    case 3:
      uVar30 = *(int *)(puVar7 + 4) * *(int *)(puVar7 + -0x54);
      goto LAB_005071d5;
    case 4:
      if (*(int *)(puVar7 + 4) == 0) {
LAB_00507772:
        FParseContext::PrintError(pFVar8,"Division by zero");
      }
      else {
        local_b8 = (undefined8 *)CONCAT44(uVar12,*(int *)(puVar7 + -0x54) / *(int *)(puVar7 + 4));
      }
      goto LAB_00507796;
    case 5:
      if (*(int *)(puVar7 + 4) == 0) goto LAB_00507772;
      local_b8 = (undefined8 *)CONCAT44(uVar12,*(int *)(puVar7 + -0x54) % *(int *)(puVar7 + 4));
      goto LAB_00507796;
    case 6:
      uVar30 = *(uint *)(puVar7 + 4) | *(uint *)(puVar7 + -0x54);
      goto LAB_005071d5;
    case 7:
      uVar30 = *(uint *)(puVar7 + 4) & *(uint *)(puVar7 + -0x54);
      goto LAB_005071d5;
    case 8:
      uVar30 = *(uint *)(puVar7 + 4) ^ *(uint *)(puVar7 + -0x54);
LAB_005071d5:
      local_b8 = (undefined8 *)CONCAT44(uVar12,uVar30);
LAB_0050779a:
      *(uint *)(puVar7 + -0x54) = uVar30;
      puVar28 = local_b8;
      break;
    case 9:
      *(int *)(puVar7 + -0x28) = -*(int *)(puVar7 + 4);
      break;
    case 10:
    case 0x1d:
      uVar30 = *(uint *)(puVar7 + -0x28);
      goto LAB_0050779a;
    case 0xb:
      puVar27 = puVar7 + -0x80;
      iVar32 = *(int *)(puVar7 + -0x28);
      goto LAB_00506ebd;
    case 0xc:
      pFVar8->EnumVal = 0;
      break;
    case 0xd:
      puVar27 = puVar7 + 4;
      iVar32 = pFVar8->EnumVal;
      pFVar8->EnumVal = iVar32 + 1;
LAB_00506ebd:
      FParseContext::AddSym(pFVar8,(char *)puVar27,iVar32);
      break;
    case 0xe:
      FParseContext::AddSym(pFVar8,(char *)(puVar7 + -0x54),*(int *)(puVar7 + 4));
      pFVar8->EnumVal = *(int *)(puVar7 + 4) + 1;
      break;
    case 0xf:
      uVar4 = *(undefined4 *)(puVar7 + 4);
      *(undefined4 *)&pFVar8[1]._vptr_FParseContext = uVar4;
      local_b8 = (undefined8 *)CONCAT44(uVar12,uVar4);
      *(undefined4 *)(puVar7 + 4) = uVar4;
      puVar28 = local_b8;
      break;
    case 0x10:
      uVar30 = *(uint *)(puVar7 + -0x130);
      lVar31 = (long)(int)uVar30;
      if (-1 < lVar31) {
        iVar32 = *(int *)(puVar7 + -0x28);
        iVar5 = *(int *)(puVar7 + -0xd8);
        uVar3 = puVar7[-0x80];
        iVar6 = *(int *)(puVar7 + -0x1c);
        iVar33 = *(int *)(puVar7 + -0x24);
        iVar39 = *(int *)(puVar7 + -0x22);
        iVar42 = *(int *)(puVar7 + -0x20);
        iVar43 = *(int *)(puVar7 + -0x1e);
        if (SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Count <= uVar30) {
          local_64 = *(int *)(puVar7 + -0x1e);
          local_60 = *(int *)(puVar7 + -0x20);
          local_5c = *(int *)(puVar7 + -0x22);
          local_58 = *(int *)(puVar7 + -0x24);
          TArray<FLineTrans,_FLineTrans>::Resize
                    (&SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>,uVar30 + 1);
          iVar33 = local_58;
          iVar39 = local_5c;
          iVar42 = local_60;
          iVar43 = local_64;
        }
        pFVar20 = SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array;
        SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array[lVar31].special =
             (uint)uVar3;
        pFVar20[lVar31].flags = iVar32 + iVar5;
        pFVar20[lVar31].args[0] = iVar33;
        pFVar20[lVar31].args[1] = iVar39;
        pFVar20[lVar31].args[2] = iVar42;
        pFVar20[lVar31].args[3] = iVar43;
        pFVar20[lVar31].args[4] = iVar6;
      }
      *(undefined4 *)&pFVar8[1]._vptr_FParseContext = 0xffffffff;
      break;
    case 0x11:
      Printf("%s, line %d: %s is undefined\n",pFVar8->SourceFile,(ulong)(uint)pFVar8->SourceLine,
             puVar7 + -0x80);
      *(undefined4 *)&pFVar8[1]._vptr_FParseContext = 0xffffffff;
      break;
    case 0x12:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = *(int *)(puVar7 + 4);
      XlatExpressions.Count = XlatExpressions.Count + 1;
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 0;
      local_b8 = (undefined8 *)CONCAT44(uVar12,XlatExpressions.Count);
      uVar30 = XlatExpressions.Count;
      goto LAB_005073fe;
    case 0x13:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 1;
      uVar30 = XlatExpressions.Count;
LAB_005073fe:
      XlatExpressions.Count = uVar30 + 1;
      *(uint *)(puVar7 + 4) = uVar30;
      puVar28 = local_b8;
      break;
    case 0x14:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 2;
      goto LAB_005075ae;
    case 0x15:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 3;
      goto LAB_005075ae;
    case 0x16:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 4;
      goto LAB_005075ae;
    case 0x17:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 5;
      goto LAB_005075ae;
    case 0x18:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 6;
      goto LAB_005075ae;
    case 0x19:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 8;
      goto LAB_005075ae;
    case 0x1a:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 7;
      goto LAB_005075ae;
    case 0x1b:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 9;
LAB_005075ae:
      uVar30 = XlatExpressions.Count + 1;
      *(uint *)(puVar7 + -0x54) = XlatExpressions.Count;
      XlatExpressions.Count = uVar30;
      break;
    case 0x1c:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 10;
      uVar30 = XlatExpressions.Count + 1;
      *(uint *)(puVar7 + -0x28) = XlatExpressions.Count;
      XlatExpressions.Count = uVar30;
      break;
    case 0x1e:
      uVar30 = *(uint *)(puVar7 + 4);
      if (XlatExpressions.Array[(int)uVar30] == 1) {
        local_b8 = (undefined8 *)0x100000000;
        if ((uVar30 < XlatExpressions.Count) &&
           (XlatExpressions.Count = XlatExpressions.Count - 1, uVar30 < XlatExpressions.Count)) {
          memmove(XlatExpressions.Array + uVar30,XlatExpressions.Array + (uVar30 + 1),
                  (ulong)(XlatExpressions.Count - uVar30) << 2);
        }
      }
      else {
        local_3c.linetype = *(int *)&pFVar8[1]._vptr_FParseContext;
        local_3c.tag = 0;
        local_3c.bIsConstant = true;
        piVar29 = (*XlatExprEval[XlatExpressions.Array[*(int *)(puVar7 + 4)]])
                            ((int *)&local_54,XlatExpressions.Array + *(int *)(puVar7 + 4),&local_3c
                            );
        if (local_3c.bIsConstant == true) {
          local_b8 = (undefined8 *)(ulong)local_54;
          if (piVar29 + 1 < XlatExpressions.Array) {
            __assert_fail("endpt >= &XlatExpressions[0]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/xlat/xlat_parser.y"
                          ,0x9b,"void yy_reduce(yyParser *, unsigned int)");
          }
          TArray<int,_int>::Resize
                    (&XlatExpressions,
                     (uint)((ulong)((long)(piVar29 + 1) - (long)XlatExpressions.Array) >> 2));
        }
        else {
          local_b8 = (undefined8 *)CONCAT44(2,*(undefined4 *)(puVar7 + 4));
        }
      }
      goto LAB_00507a9e;
    case 0x1f:
      local_b8 = (undefined8 *)CONCAT44(1,*(int *)(puVar7 + 6) << 0x14);
      auStack_b0[0] = *(undefined4 *)(puVar7 + 4);
      auStack_b0[1] = 0;
      auStack_b0[2] = 0;
      uStack_a4 = 0;
      puVar7[10] = 0;
      puVar7[0xb] = 0;
      puVar7[0xc] = 0;
      puVar7[0xd] = 0;
      puVar7[0xe] = 0;
      puVar7[0xf] = 0;
      puVar7[0x10] = 0;
      puVar7[0x11] = 0;
      *(int *)(puVar7 + 4) = *(int *)(puVar7 + 6) << 0x14;
      puVar7[6] = 1;
      puVar7[7] = 0;
      *(undefined4 *)(puVar7 + 8) = auStack_b0[0];
      puVar7[10] = 0;
      puVar7[0xb] = 0;
      puVar28 = local_b8;
      break;
    case 0x20:
      uVar34 = *(undefined8 *)(puVar7 + -0x54);
      uStack_a4 = *(undefined8 *)(puVar7 + -0x4a);
      auStack_b0[0] = (undefined4)*(undefined8 *)(puVar7 + -0x50);
      auStack_b0[1] = (undefined4)*(undefined8 *)(puVar7 + -0x4e);
      auStack_b0[2] = (undefined4)((ulong)*(undefined8 *)(puVar7 + -0x4e) >> 0x20);
      local_b8._4_4_ = (int)((ulong)uVar34 >> 0x20);
      iVar32 = local_b8._4_4_;
      local_b8._0_4_ = (uint)uVar34;
      if ((long)local_b8._4_4_ < 5) {
        iVar32 = *(int *)(puVar7 + 6);
        auStack_b0[local_b8._4_4_] = *(undefined4 *)(puVar7 + 4);
        local_b8 = (undefined8 *)
                   CONCAT44(local_b8._4_4_ + 1,
                            (uint)local_b8 |
                            iVar32 << ((char)((ulong)uVar34 >> 0x20) * '\x02' + 0x14U & 0x1f));
      }
      else {
        local_b8 = (undefined8 *)CONCAT44(local_b8._4_4_ + 1,(uint)local_b8);
        if (iVar32 == 5) {
          FParseContext::PrintError(pFVar8,"Line special has too many arguments\n");
        }
      }
      *(undefined4 *)(puVar7 + -0x4e) = auStack_b0[1];
      *(undefined4 *)(puVar7 + -0x4c) = auStack_b0[2];
      *(undefined4 *)(puVar7 + -0x4a) = (undefined4)uStack_a4;
      *(undefined4 *)(puVar7 + -0x48) = uStack_a4._4_4_;
      *(uint *)(puVar7 + -0x54) = (uint)local_b8;
      *(int *)(puVar7 + -0x52) = local_b8._4_4_;
      *(ulong *)(puVar7 + -0x50) = CONCAT44(auStack_b0[1],auStack_b0[0]);
      puVar28 = local_b8;
      break;
    case 0x21:
      puVar7[0x36] = 0;
      puVar7[0x37] = 0;
      puVar7[0x38] = 0;
      puVar7[0x39] = 0;
      puVar7[0x3a] = 0;
      puVar7[0x3b] = 0;
      puVar7[0x3c] = 0;
      puVar7[0x3d] = 0;
      puVar7[0x30] = 0;
      puVar7[0x31] = 0;
      puVar7[0x32] = 0;
      puVar7[0x33] = 0;
      puVar7[0x34] = 0;
      puVar7[0x35] = 0;
      puVar7[0x36] = 0;
      puVar7[0x37] = 0;
      break;
    case 0x22:
      lVar31 = (long)NumBoomish;
      if (lVar31 == 0x10) {
        puVar19 = *(undefined8 **)(puVar7 + -0x28);
        while (puVar19 != (undefined8 *)0x0) {
          puVar10 = (undefined8 *)*puVar19;
          operator_delete(puVar19,0x40);
          puVar19 = puVar10;
        }
        Printf("%s, line %d: Too many BOOM translators\n",pFVar8->SourceFile,
               (ulong)(uint)pFVar8->SourceLine);
      }
      else {
        Boomish[lVar31].FirstLinetype = puVar7[-0x104];
        Boomish[lVar31].LastLinetype = puVar7[-0xac];
        Boomish[lVar31].NewSpecial = (BYTE)puVar7[-0x188];
        puVar19 = *(undefined8 **)(puVar7 + -0x28);
        iVar32 = NumBoomish;
        while (puVar19 != (undefined8 *)0x0) {
          puVar10 = (undefined8 *)*puVar19;
          NumBoomish = iVar32;
          TArray<FBoomArg,_FBoomArg>::Grow(&Boomish[iVar32].Args,1);
          pFVar11 = Boomish[iVar32].Args.Array;
          uVar30 = Boomish[iVar32].Args.Count;
          *(undefined8 *)(pFVar11[uVar30].ResultValue + 8) = *(undefined8 *)((long)puVar19 + 0x36);
          uVar34 = puVar19[1];
          uVar15 = puVar19[2];
          uVar16 = puVar19[3];
          uVar17 = puVar19[4];
          uVar18 = puVar19[6];
          *(undefined8 *)(pFVar11[uVar30].ResultFilter + 0xc) = puVar19[5];
          *(undefined8 *)(pFVar11[uVar30].ResultFilter + 0xc + 4) = uVar18;
          *(undefined8 *)(pFVar11[uVar30].ResultFilter + 4) = uVar16;
          *(undefined8 *)(pFVar11[uVar30].ResultFilter + 4 + 4) = uVar17;
          pFVar11 = pFVar11 + uVar30;
          pFVar11->bOrExisting = (bool)(char)uVar34;
          pFVar11->bUseConstant = (bool)(char)((ulong)uVar34 >> 8);
          pFVar11->ListSize = (char)((ulong)uVar34 >> 0x10);
          pFVar11->ArgNum = (char)((ulong)uVar34 >> 0x18);
          pFVar11->ConstantValue = (char)((ulong)uVar34 >> 0x20);
          pFVar11->field_0x5 = (char)((ulong)uVar34 >> 0x28);
          pFVar11->AndValue = (short)((ulong)uVar34 >> 0x30);
          *(undefined8 *)pFVar11->ResultFilter = uVar15;
          puVar1 = &Boomish[iVar32].Args.Count;
          *puVar1 = *puVar1 + 1;
          operator_delete(puVar19,0x40);
          puVar19 = puVar10;
          iVar32 = NumBoomish;
        }
        NumBoomish = iVar32 + 1;
      }
      break;
    case 0x23:
      puVar7[0x30] = 0;
      puVar7[0x31] = 0;
      puVar7[0x32] = 0;
      puVar7[0x33] = 0;
      break;
    case 0x24:
      puVar28 = (undefined8 *)operator_new(0x40);
      *puVar28 = *(undefined8 *)(puVar7 + 4);
      *(undefined8 *)((long)puVar28 + 0x36) = *(undefined8 *)(puVar7 + -0x11);
      uVar12 = *(undefined4 *)(puVar7 + -0x28);
      uVar4 = *(undefined4 *)(puVar7 + -0x26);
      uVar13 = *(undefined4 *)(puVar7 + -0x24);
      uVar14 = *(undefined4 *)(puVar7 + -0x22);
      uVar34 = *(undefined8 *)(puVar7 + -0x20);
      uVar15 = *(undefined8 *)(puVar7 + -0x1c);
      uVar16 = *(undefined8 *)(puVar7 + -0x14);
      puVar28[5] = *(undefined8 *)(puVar7 + -0x18);
      puVar28[6] = uVar16;
      puVar28[3] = uVar34;
      puVar28[4] = uVar15;
      *(undefined4 *)(puVar28 + 1) = uVar12;
      *(undefined4 *)((long)puVar28 + 0xc) = uVar4;
      *(undefined4 *)(puVar28 + 2) = uVar13;
      *(undefined4 *)((long)puVar28 + 0x14) = uVar14;
      *(undefined8 **)(puVar7 + -0x28) = puVar28;
      break;
    case 0x25:
      plVar44 = *(long **)(puVar7 + 8);
      local_b8._0_2_ = CONCAT11(plVar44 == (long *)0x0,*(int *)(puVar7 + -0x28) == 0x14);
      uVar23 = (ushort)local_b8;
      local_b8._0_4_ = CONCAT13((char)puVar7[-0x54],(undefined3)local_b8);
      local_b8._5_3_ = SUB83(puVar19,5);
      local_b8._0_5_ = CONCAT14((char)puVar7[4],(uint)local_b8);
      local_b8 = (undefined8 *)CONCAT26(puVar7[5],(undefined6)local_b8);
      if (plVar44 != (long *)0x0) {
        uVar35 = 0;
        do {
          plVar9 = (long *)*plVar44;
          if (uVar35 < 0xf) {
            *(short *)((long)auStack_b0 + uVar35 * 2) = (short)plVar44[1];
            *(undefined1 *)((long)&local_98 + uVar35 + 6) = *(undefined1 *)((long)plVar44 + 10);
          }
          else if (uVar35 == 0xf) {
            FParseContext::PrintError(pFVar8,"Lists can only have 15 elements");
          }
          operator_delete(plVar44,0x10);
          uVar35 = uVar35 + 1;
          plVar44 = plVar9;
        } while (plVar9 != (long *)0x0);
        uVar25 = 0xf;
        if ((uint)uVar35 < 0xf) {
          uVar25 = (undefined1)uVar35;
        }
        local_b8._0_3_ = CONCAT12(uVar25,uVar23);
      }
      *(ulong *)(puVar7 + -0x3d) = CONCAT62(uStack_88,uStack_8a);
      *(undefined8 *)(puVar7 + -0x44) = local_98;
      *(ulong *)(puVar7 + -0x40) = CONCAT26(uStack_8a,uStack_90);
      *(undefined4 *)(puVar7 + -0x4c) = auStack_b0[2];
      *(undefined4 *)(puVar7 + -0x4a) = (undefined4)uStack_a4;
      *(undefined4 *)(puVar7 + -0x48) = uStack_a4._4_4_;
      *(undefined4 *)(puVar7 + -0x46) = uStack_9c;
      puVar7[-0x54] = (ushort)local_b8;
      *(undefined1 *)(puVar7 + -0x53) = local_b8._2_1_;
      *(undefined1 *)((long)puVar7 + -0xa5) = local_b8._3_1_;
      *(undefined1 *)(puVar7 + -0x52) = local_b8._4_1_;
      *(undefined1 *)((long)puVar7 + -0xa3) = local_b8._5_1_;
      puVar7[-0x51] = local_b8._6_2_;
      *(ulong *)(puVar7 + -0x50) = CONCAT44(auStack_b0[1],auStack_b0[0]);
      puVar28 = local_b8;
      break;
    case 0x26:
      puVar7[4] = 4;
      puVar7[5] = 0;
      break;
    case 0x27:
      puVar7[4] = 0;
      puVar7[5] = 0;
      break;
    case 0x28:
    case 0x39:
      puVar7[4] = 1;
      puVar7[5] = 0;
      break;
    case 0x29:
      puVar7[4] = 2;
      puVar7[5] = 0;
      break;
    case 0x2a:
      puVar7[4] = 3;
      puVar7[5] = 0;
      break;
    case 0x2b:
      puVar7[4] = 0x3d;
      puVar7[5] = 0;
      break;
    case 0x2c:
      puVar7[4] = 0x14;
      puVar7[5] = 0;
      break;
    case 0x2d:
      local_b8 = (undefined8 *)CONCAT71(uVar24,(char)puVar7[4]);
      puVar28 = local_b8;
      auStack_b0[0] = 0;
      auStack_b0[1] = 0;
      *(char *)(puVar7 + 4) = (char)puVar7[4];
      local_b8._1_4_ = SUB84(puVar19,1);
      *(undefined4 *)((long)puVar7 + 9) = local_b8._1_4_;
      local_b8._5_2_ = SUB82(puVar19,5);
      *(undefined2 *)((long)puVar7 + 0xd) = local_b8._5_2_;
      local_b8._7_1_ = SUB81(puVar19,7);
      *(undefined1 *)((long)puVar7 + 0xf) = local_b8._7_1_;
      puVar7[8] = 0;
      puVar7[9] = 0;
      puVar7[10] = 0;
      puVar7[0xb] = 0;
      break;
    case 0x2e:
      uVar3 = puVar7[-0x80];
      local_b8._0_4_ = CONCAT22(uVar3,(ushort)local_b8);
      local_b8 = (undefined8 *)CONCAT44(uVar12,(uint)local_b8);
      uVar34 = *(undefined8 *)(puVar7 + -0x28);
      auStack_b0[0] = (undefined4)uVar34;
      auStack_b0[1] = (undefined4)((ulong)uVar34 >> 0x20);
      puVar7[-0x80] = (ushort)local_b8;
      puVar7[-0x7f] = uVar3;
      *(undefined4 *)(puVar7 + -0x7e) = uVar12;
      *(undefined8 *)(puVar7 + -0x7c) = uVar34;
      puVar28 = local_b8;
      break;
    case 0x2f:
      local_b8 = (undefined8 *)operator_new(0x10);
      *local_b8 = 0;
      *(undefined4 *)(local_b8 + 1) = *(undefined4 *)(puVar7 + 4);
LAB_00507a9e:
      *(undefined8 **)(puVar7 + 4) = local_b8;
      puVar28 = local_b8;
      break;
    case 0x30:
      puVar28 = (undefined8 *)operator_new(0x10);
      *puVar28 = *(undefined8 *)(puVar7 + 4);
      *(undefined4 *)(puVar28 + 1) = *(undefined4 *)(puVar7 + -0x54);
      *(undefined8 **)(puVar7 + -0x54) = puVar28;
      break;
    case 0x31:
      local_b8._0_3_ = CONCAT12((char)puVar7[4],puVar7[-0x54]);
LAB_00507796:
      uVar30 = (uint)local_b8;
      goto LAB_0050779a;
    case 0x32:
      TArray<FLineTrans,_FLineTrans>::Resize
                (&SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>,
                 *(int *)(puVar7 + -0x28) + 1);
      break;
    case 0x33:
      uVar30 = *(uint *)(puVar7 + -0x80);
      lVar31 = (long)(int)uVar30;
      if (-1 < lVar31) {
        iVar32 = *(int *)(puVar7 + -0x28);
        if (SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>.Count <= uVar30) {
          TArray<FSectorTrans,_FSectorTrans>::Resize
                    (&SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>,uVar30 + 1);
        }
        pFVar21 = SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>.Array;
        SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>.Array[lVar31].newtype = iVar32;
        pFVar21[lVar31].bitmask_allowed = true;
      }
      break;
    case 0x34:
      Printf("Unknown constant \'%s\'\n",puVar7 + -0x28);
      break;
    case 0x35:
      uVar30 = *(uint *)(puVar7 + -0xac);
      lVar31 = (long)(int)uVar30;
      if (-1 < lVar31) {
        iVar32 = *(int *)(puVar7 + -0x54);
        if (SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>.Count <= uVar30) {
          TArray<FSectorTrans,_FSectorTrans>::Resize
                    (&SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>,uVar30 + 1);
        }
        pFVar21 = SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>.Array;
        SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>.Array[lVar31].newtype = iVar32;
        pFVar21[lVar31].bitmask_allowed = false;
      }
      break;
    case 0x36:
      iVar32 = *(int *)(puVar7 + -0x80);
      iVar5 = *(int *)(puVar7 + -0x54);
      iVar6 = *(int *)(puVar7 + -0x28);
      TArray<FSectorMask,_FSectorMask>::Grow(&SectorMasks,1);
      pFVar22 = SectorMasks.Array;
      uVar35 = (ulong)SectorMasks.Count;
      SectorMasks.Array[uVar35].mask = iVar32;
      pFVar22[uVar35].op = iVar5;
      pFVar22[uVar35].shift = iVar6;
      goto LAB_00507696;
    case 0x37:
      iVar32 = *(int *)(puVar7 + -0x28);
      TArray<FSectorMask,_FSectorMask>::Grow(&SectorMasks,1);
      pFVar22 = SectorMasks.Array;
      uVar35 = (ulong)SectorMasks.Count;
      SectorMasks.Array[uVar35].mask = iVar32;
      pFVar22[uVar35].op = 0;
      pFVar22[uVar35].shift = 0;
      goto LAB_00507696;
    case 0x38:
      iVar32 = *(int *)(puVar7 + -0x54);
      TArray<FSectorMask,_FSectorMask>::Grow(&SectorMasks,1);
      pFVar22 = SectorMasks.Array;
      uVar35 = (ulong)SectorMasks.Count;
      SectorMasks.Array[uVar35].mask = iVar32;
      pFVar22[uVar35].op = 0;
      pFVar22[uVar35].shift = 1;
LAB_00507696:
      SectorMasks.Count = SectorMasks.Count + 1;
      break;
    case 0x3a:
      puVar7[4] = 0xffff;
      puVar7[5] = 0xffff;
      break;
    case 0x3b:
      if ((ulong)*(uint *)(puVar7 + -0x80) < 0x10) {
        LineFlagTranslations[*(uint *)(puVar7 + -0x80)].newvalue = *(int *)(puVar7 + -0x28);
        LineFlagTranslations[*(int *)(puVar7 + -0x80)].ismask = false;
      }
      break;
    case 0x3c:
      if ((ulong)*(uint *)(puVar7 + -0x80) < 0x10) {
        LineFlagTranslations[*(uint *)(puVar7 + -0x80)].newvalue = *(int *)(puVar7 + -0x28);
        LineFlagTranslations[*(int *)(puVar7 + -0x80)].ismask = true;
      }
    }
    local_b8 = puVar28;
    if (0x31 < (ulong)puVar7[uVar41 * -0x2c]) {
      __assert_fail("stateno<=YY_REDUCE_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O1/src/xlat_parser.c"
                    ,0x32f,"int yy_find_reduce_action(int, unsigned char)");
    }
    bVar2 = yyRuleInfo[uVar26].lhs;
    if (bVar2 == 0x47) {
      __assert_fail("iLookAhead!=YYNOCODE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O1/src/xlat_parser.c"
                    ,0x333,"int yy_find_reduce_action(int, unsigned char)");
    }
    uVar30 = (int)yy_reduce_ofst[puVar7[uVar41 * -0x2c]] + (uint)bVar2;
    if (0x165 < uVar30) {
      __assert_fail("i>=0 && i<YY_ACTTAB_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O1/src/xlat_parser.c"
                    ,0x33a,"int yy_find_reduce_action(int, unsigned char)");
    }
    if ("+,-./012345)*8:;\x02\x03\x04\x05\x06\a\b\t\x0f\x02\x03\x04\x05\x06\a\b\t\x02\x03\x04\x05\x06\a\b\t\x05\x06\a\b\t ABC$%&"
        [uVar30] != bVar2) {
      __assert_fail("yy_lookahead[i]==iLookAhead",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O1/src/xlat_parser.c"
                    ,0x33b,"int yy_find_reduce_action(int, unsigned char)");
    }
    if (uVar30 == 0xb) {
      *(ulong *)yyp = *yyp + uVar41 * -0x58;
      uVar34 = *(undefined8 *)((long)yyp + 0x10);
      if (yyTraceFILE != (FILE *)0x0) {
        fprintf((FILE *)yyTraceFILE,"%sAccept!\n",yyTracePrompt);
        fflush((FILE *)yyTraceFILE);
      }
      *(undefined4 *)((long)yyp + 8) = 0xffffffff;
      while (uVar45 < *yyp) {
        yy_pop_parser_stack((yyParser *)yyp);
      }
      *(undefined8 *)((long)yyp + 0x10) = uVar34;
    }
    else {
      if (uVar30 == 0x35) {
        __assert_fail("yyact == YY_ACCEPT_ACTION",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O1/src/xlat_parser.c"
                      ,0x6d1,"void yy_reduce(yyParser *, unsigned int)");
      }
      uVar3 = yy_action[uVar30];
      uVar30 = uVar3 + 0x4e;
      if (uVar3 < 100) {
        uVar30 = (uint)uVar3;
      }
      lVar31 = 1 - uVar41;
      *(ushort **)yyp = puVar7 + lVar31 * 0x2c;
      puVar7[lVar31 * 0x2c] = (ushort)uVar30;
      *(byte *)(puVar7 + lVar31 * 0x2c + 1) = bVar2;
      yyTraceShift((yyParser *)yyp,uVar30);
    }
LAB_005078a2:
    if ((uVar38 == 0x47) || (*yyp <= uVar45)) {
      if (yyTraceFILE != (FILE *)0x0) {
        fprintf((FILE *)yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
        uVar45 = (long)yyp + 0x70;
        if (uVar45 <= *yyp) {
          uVar34 = 0x5b;
          do {
            fprintf((FILE *)yyTraceFILE,"%c%s",uVar34,yyTokenName[*(byte *)(uVar45 + 2)]);
            uVar45 = uVar45 + 0x58;
            uVar34 = 0x20;
          } while (uVar45 <= *yyp);
        }
        fwrite("]\n",2,1,(FILE *)yyTraceFILE);
        fflush((FILE *)yyTraceFILE);
      }
      return;
    }
  } while( true );
}

Assistant:

void XlatParse(
  void *yyp,                   /* The parser */
  int yymajor,                 /* The major token code number */
  XlatParseTOKENTYPE yyminor       /* The value for the token */
  XlatParseARG_PDECL               /* Optional %extra_argument parameter */
){
  YYMINORTYPE yyminorunion;
  unsigned int yyact;   /* The parser action. */
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  int yyendofinput;     /* True if we are at the end of input */
#endif
#ifdef YYERRORSYMBOL
  int yyerrorhit = 0;   /* True if yymajor has invoked an error */
#endif
  yyParser *yypParser;  /* The parser */

  yypParser = (yyParser*)yyp;
  assert( yypParser->yytos!=0 );
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  yyendofinput = (yymajor==0);
#endif
  XlatParseARG_STORE;

#ifndef NDEBUG
  if( yyTraceFILE ){
    fprintf(yyTraceFILE,"%sInput '%s'\n",yyTracePrompt,yyTokenName[yymajor]);
    fflush(yyTraceFILE);
  }
#endif

  do{
    yyact = yy_find_shift_action(yypParser,(YYCODETYPE)yymajor);
    if( yyact <= YY_MAX_SHIFTREDUCE ){
      yy_shift(yypParser,yyact,yymajor,yyminor);
#ifndef YYNOERRORRECOVERY
      yypParser->yyerrcnt--;
#endif
      yymajor = YYNOCODE;
    }else if( yyact <= YY_MAX_REDUCE ){
      yy_reduce(yypParser,yyact-YY_MIN_REDUCE);
    }else{
      assert( yyact == YY_ERROR_ACTION );
      yyminorunion.yy0 = yyminor;
#ifdef YYERRORSYMBOL
      int yymx;
#endif
#ifndef NDEBUG
      if( yyTraceFILE ){
        fprintf(yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
        fflush(yyTraceFILE);
      }
#endif
#ifdef YYERRORSYMBOL
      /* A syntax error has occurred.
      ** The response to an error depends upon whether or not the
      ** grammar defines an error token "ERROR".  
      **
      ** This is what we do if the grammar does define ERROR:
      **
      **  * Call the %syntax_error function.
      **
      **  * Begin popping the stack until we enter a state where
      **    it is legal to shift the error symbol, then shift
      **    the error symbol.
      **
      **  * Set the error count to three.
      **
      **  * Begin accepting and shifting new tokens.  No new error
      **    processing will occur until three tokens have been
      **    shifted successfully.
      **
      */
      if( yypParser->yyerrcnt<0 ){
        yy_syntax_error(yypParser,yymajor,yyminor);
      }
      yymx = yypParser->yytos->major;
      if( yymx==YYERRORSYMBOL || yyerrorhit ){
#ifndef NDEBUG
        if( yyTraceFILE ){
          fprintf(yyTraceFILE,"%sDiscard input token %s\n",
             yyTracePrompt,yyTokenName[yymajor]);
          fflush(yyTraceFILE);
        }
#endif
        yy_destructor(yypParser, (YYCODETYPE)yymajor, &yyminorunion);
        yymajor = YYNOCODE;
      }else{
        while( yypParser->yytos >= yypParser->yystack
            && yymx != YYERRORSYMBOL
            && (yyact = yy_find_reduce_action(
                        yypParser->yytos->stateno,
                        YYERRORSYMBOL)) >= YY_MIN_REDUCE
        ){
          yy_pop_parser_stack(yypParser);
        }
        if( yypParser->yytos < yypParser->yystack || yymajor==0 ){
          yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
          yy_parse_failed(yypParser);
#ifndef YYNOERRORRECOVERY
          yypParser->yyerrcnt = -1;
#endif
          yymajor = YYNOCODE;
        }else if( yymx!=YYERRORSYMBOL ){
          yy_shift(yypParser,yyact,YYERRORSYMBOL,yyminor);
        }
      }
      yypParser->yyerrcnt = 3;
      yyerrorhit = 1;
#elif defined(YYNOERRORRECOVERY)
      /* If the YYNOERRORRECOVERY macro is defined, then do not attempt to
      ** do any kind of error recovery.  Instead, simply invoke the syntax
      ** error routine and continue going as if nothing had happened.
      **
      ** Applications can set this macro (for example inside %include) if
      ** they intend to abandon the parse upon the first syntax error seen.
      */
      yy_syntax_error(yypParser,yymajor, yyminor);
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      yymajor = YYNOCODE;
      
#else  /* YYERRORSYMBOL is not defined */
      /* This is what we do if the grammar does not define ERROR:
      **
      **  * Report an error message, and throw away the input token.
      **
      **  * If the input token is $, then fail the parse.
      **
      ** As before, subsequent error messages are suppressed until
      ** three input tokens have been successfully shifted.
      */
      if( yypParser->yyerrcnt<=0 ){
        yy_syntax_error(yypParser,yymajor, yyminor);
      }
      yypParser->yyerrcnt = 3;
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      if( yyendofinput ){
        yy_parse_failed(yypParser);
#ifndef YYNOERRORRECOVERY
        yypParser->yyerrcnt = -1;
#endif
      }
      yymajor = YYNOCODE;
#endif
    }
  }while( yymajor!=YYNOCODE && yypParser->yytos>yypParser->yystack );
#ifndef NDEBUG
  if( yyTraceFILE ){
    yyStackEntry *i;
    char cDiv = '[';
    fprintf(yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
    for(i=&yypParser->yystack[1]; i<=yypParser->yytos; i++){
      fprintf(yyTraceFILE,"%c%s", cDiv, yyTokenName[i->major]);
      cDiv = ' ';
    }
    fprintf(yyTraceFILE,"]\n");
    fflush(yyTraceFILE);
  }
#endif
  return;
}